

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printU8ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *op;
  ulong uVar2;
  uint8_t *puVar3;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t Value;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar2 = MCOperand_getImm(op);
  if ((byte)uVar2 < 10) {
    SStream_concat(in_RDX,"%u",uVar2 & 0xff);
  }
  else {
    SStream_concat(in_RDX,"0x%x",uVar2 & 0xff);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar3 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar3[0] = '\x02';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    *(ulong *)(in_RDI->flat_insn->detail->groups +
              (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d) =
         uVar2 & 0xff;
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printU8ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	uint8_t Value = (uint8_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isUInt<8>(Value) && "Invalid u8imm argument");

	if (Value > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", Value);
	else
		SStream_concat(O, "%u", Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}